

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrCreateSceneMSFT
                   (XrSceneObserverMSFT sceneObserver,XrSceneCreateInfoMSFT *createInfo,
                   XrSceneMSFT *scene)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  XrSceneObserverMSFT_T *in_stack_fffffffffffffd98;
  string local_260;
  XrSceneObserverMSFT sceneObserver_local;
  string local_238;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_200;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3b9c44e8;
  sceneObserver_local = sceneObserver;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSceneObserverMSFT_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&sceneObserver_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSceneObserverMSFTHandle(&sceneObserver_local);
  if (VVar1 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSceneObserverMSFT handle \"sceneObserver\" ");
    HandleToHexString<XrSceneObserverMSFT_T*>(in_stack_fffffffffffffd98);
    std::operator<<((ostream *)&oss,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::string
              ((string *)&local_260,"VUID-xrCreateSceneMSFT-sceneObserver-parameter",
               (allocator *)&stack0xfffffffffffffd9f);
    std::__cxx11::string::string
              ((string *)&local_238,"xrCreateSceneMSFT",(allocator *)&stack0xfffffffffffffd9e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_260,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_238,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b0,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
    goto LAB_001dbc7b;
  }
  pVar3 = HandleInfo<XrSceneObserverMSFT_T_*>::getWithInstanceInfo
                    (&g_sceneobservermsft_info,sceneObserver_local);
  instance_info = pVar3.second;
  if (createInfo == (XrSceneCreateInfoMSFT *)0x0) {
LAB_001dbbc3:
    XVar2 = XR_SUCCESS;
    if (scene != (XrSceneMSFT *)0x0) goto LAB_001dbc7b;
    std::__cxx11::string::string
              ((string *)&oss,"VUID-xrCreateSceneMSFT-scene-parameter",(allocator *)&local_200);
    std::__cxx11::string::string
              ((string *)&local_260,"xrCreateSceneMSFT",(allocator *)&stack0xfffffffffffffd9f);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,&objects_info);
    std::__cxx11::string::string
              ((string *)&local_238,
               "Invalid NULL for XrSceneMSFT \"scene\" which is not optional and must be non-NULL",
               (allocator *)&stack0xfffffffffffffd9e);
    CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    this = &local_1e0;
  }
  else {
    std::__cxx11::string::string((string *)&oss,"xrCreateSceneMSFT",(allocator *)&local_260);
    XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,createInfo);
    std::__cxx11::string::~string((string *)&oss);
    if (XVar2 == XR_SUCCESS) goto LAB_001dbbc3;
    std::__cxx11::string::string
              ((string *)&oss,"VUID-xrCreateSceneMSFT-createInfo-parameter",(allocator *)&local_200)
    ;
    std::__cxx11::string::string
              ((string *)&local_260,"xrCreateSceneMSFT",(allocator *)&stack0xfffffffffffffd9f);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c8,&objects_info);
    std::__cxx11::string::string
              ((string *)&local_238,"Command xrCreateSceneMSFT param createInfo is invalid",
               (allocator *)&stack0xfffffffffffffd9e);
    CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c8,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    this = &local_1c8;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&oss);
  XVar2 = XR_ERROR_VALIDATION_FAILURE;
LAB_001dbc7b:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrCreateSceneMSFT(
XrSceneObserverMSFT sceneObserver,
const XrSceneCreateInfoMSFT* createInfo,
XrSceneMSFT* scene) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(sceneObserver, XR_OBJECT_TYPE_SCENE_OBSERVER_MSFT);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSceneObserverMSFTHandle(&sceneObserver);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSceneObserverMSFT handle \"sceneObserver\" ";
                oss << HandleToHexString(sceneObserver);
                CoreValidLogMessage(nullptr, "VUID-xrCreateSceneMSFT-sceneObserver-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateSceneMSFT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_sceneobservermsft_info.getWithInstanceInfo(sceneObserver);
        GenValidUsageXrHandleInfo *gen_sceneobservermsft_info = info_with_instance.first;
        (void)gen_sceneobservermsft_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Validate that the structure XrSceneCreateInfoMSFT is valid
        if (nullptr != createInfo) {
            xr_result = ValidateXrStruct(gen_instance_info, "xrCreateSceneMSFT",
                                                            objects_info, false, true, createInfo);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(gen_instance_info, "VUID-xrCreateSceneMSFT-createInfo-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateSceneMSFT",
                                    objects_info,
                                    "Command xrCreateSceneMSFT param createInfo is invalid");
                return xr_result;
            }
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == scene) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrCreateSceneMSFT-scene-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateSceneMSFT", objects_info,
                                "Invalid NULL for XrSceneMSFT \"scene\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}